

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::init
          (ShaderBuiltinConstantCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  ostream *poVar3;
  int precision;
  char *pcVar4;
  string *ctx_00;
  char *local_3f8;
  bool local_38a;
  allocator<char> local_389;
  string local_388 [38];
  byte local_362;
  allocator<char> local_361;
  string local_360 [32];
  string local_340;
  undefined1 local_320 [8];
  ostringstream src;
  MessageBuilder local_198;
  int local_14;
  ShaderBuiltinConstantCase *pSStack_10;
  int refValue;
  ShaderBuiltinConstantCase *this_local;
  
  pSStack_10 = this;
  local_14 = getRefValue(this);
  this_00 = tcu::TestContext::getLog
                      ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,&this->m_varName);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])0x2bdb312);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_14);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    std::operator<<((ostream *)local_320,"varying mediump vec4 v_coords;\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_320,"attribute highp vec4 a_position;\n");
    poVar3 = std::operator<<(poVar3,"attribute highp vec4 a_coords;\n");
    std::operator<<(poVar3,"varying mediump vec4 v_color;\n");
  }
  std::operator<<((ostream *)local_320,"void main (void)\n{\n");
  poVar3 = std::operator<<((ostream *)local_320,"\tbool isOk = ");
  poVar3 = std::operator<<(poVar3,(string *)&this->m_varName);
  poVar3 = std::operator<<(poVar3," == (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
  poVar3 = std::operator<<(poVar3," + int(floor(");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_3f8 = "v_coords";
  }
  else {
    local_3f8 = "a_coords";
  }
  poVar3 = std::operator<<(poVar3,local_3f8);
  poVar3 = std::operator<<(poVar3,".x * ");
  de::floatToString_abi_cxx11_(&local_340,(de *)&DAT_00000001,4.0,precision);
  poVar3 = std::operator<<(poVar3,(string *)&local_340);
  std::operator<<(poVar3,") + 0.05));\n");
  std::__cxx11::string::~string((string *)&local_340);
  poVar3 = std::operator<<((ostream *)local_320,"\t");
  pcVar4 = "gl_FragColor";
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    pcVar4 = "v_color";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3," = isOk ? vec4(0.0, 1.0, 0.0, 1.0) : vec4(1.0, 0.0, 0.0, 1.0);\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    std::operator<<((ostream *)local_320,"\tgl_Position = a_position;\n");
  }
  std::operator<<((ostream *)local_320,"}\n");
  pcVar4 = init::defaultVertSrc;
  local_362 = 0;
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    std::allocator<char>::allocator();
    local_362 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_360,pcVar4,&local_361);
  }
  else {
    std::__cxx11::ostringstream::str();
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_360);
  std::__cxx11::string::~string(local_360);
  if ((local_362 & 1) != 0) {
    std::allocator<char>::~allocator(&local_361);
  }
  pcVar4 = init::defaultFragSrc;
  local_38a = ((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0;
  if (local_38a) {
    std::__cxx11::ostringstream::str();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_388,pcVar4,&local_389);
  }
  local_38a = !local_38a;
  ctx_00 = local_388;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,ctx_00);
  std::__cxx11::string::~string(local_388);
  if (local_38a) {
    std::allocator<char>::~allocator(&local_389);
  }
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,(EVP_PKEY_CTX *)ctx_00);
  iVar1 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  return iVar1;
}

Assistant:

void ShaderBuiltinConstantCase::init (void)
{
	const int refValue = getRefValue();
	m_testCtx.getLog() << tcu::TestLog::Message << m_varName << " = " << refValue << tcu::TestLog::EndMessage;

	static const char* defaultVertSrc =
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"	v_coords = a_coords;\n"
		"	gl_Position = a_position;\n"
		"}\n";
	static const char* defaultFragSrc =
		"varying mediump vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"	gl_FragColor = v_color;\n"
		"}\n";

	// Construct shader.
	std::ostringstream src;
	if (m_isVertexCase)
	{
		src << "attribute highp vec4 a_position;\n"
			<< "attribute highp vec4 a_coords;\n"
			<< "varying mediump vec4 v_color;\n";
	}
	else
		src << "varying mediump vec4 v_coords;\n";

	src << "void main (void)\n{\n";

	src << "\tbool isOk = " << m_varName << " == (" << refValue << " + int(floor(" << (m_isVertexCase ? "a_coords" : "v_coords") << ".x * " << de::floatToString(builtinConstScale, 1) << ") + 0.05));\n";
	src << "\t" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = isOk ? vec4(0.0, 1.0, 0.0, 1.0) : vec4(1.0, 0.0, 0.0, 1.0);\n";

	if (m_isVertexCase)
		src << "\tgl_Position = a_position;\n";

	src << "}\n";

	m_vertShaderSource		= m_isVertexCase ? src.str()		: defaultVertSrc;
	m_fragShaderSource		= m_isVertexCase ? defaultFragSrc	: src.str();

	gls::ShaderRenderCase::init();
}